

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts unpack_raw(FloatFmt fmt,uint64_t raw)

{
  FloatParts FVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int sign_pos;
  uint64_t raw_local;
  undefined2 uStack_a;
  
  uVar2 = extract64(raw,0,fmt.frac_size);
  uVar3 = extract64(raw,fmt.frac_size,fmt.exp_size);
  uVar4 = extract64(raw,fmt.frac_size + fmt.exp_size,1);
  FVar1.exp = (int)uVar3;
  FVar1.frac = uVar2;
  FVar1.cls = 0;
  FVar1.sign = uVar4 != 0;
  FVar1._14_2_ = uStack_a;
  return FVar1;
}

Assistant:

static inline FloatParts unpack_raw(FloatFmt fmt, uint64_t raw)
{
    const int sign_pos = fmt.frac_size + fmt.exp_size;

    return (FloatParts) {
        .cls = float_class_unclassified,
        .sign = extract64(raw, sign_pos, 1),
        .exp = extract64(raw, fmt.frac_size, fmt.exp_size),
        .frac = extract64(raw, 0, fmt.frac_size),
    };
}